

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O3

void ncnn::im2col_sgemm_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  void *pvVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  byte bVar16;
  byte bVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  undefined1 *puVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  ulong *puVar34;
  long lVar35;
  undefined1 (*pauVar36) [16];
  size_t sVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  void *pvVar42;
  undefined1 *puVar43;
  undefined1 (*pauVar44) [16];
  long lVar45;
  undefined1 (*pauVar46) [16];
  int iVar47;
  long lVar48;
  int iVar49;
  long lVar50;
  uint uVar51;
  undefined1 (*pauVar52) [16];
  ulong *puVar53;
  void *pvVar54;
  ushort uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar70 [16];
  undefined1 auVar69 [64];
  undefined1 auVar71 [64];
  uint uVar72;
  undefined8 uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  long local_d0;
  undefined1 local_88 [64];
  size_t local_48;
  ulong local_40;
  ulong local_38;
  undefined1 auVar59 [16];
  
  uVar5 = bottom_im2col->w;
  iVar47 = bottom_im2col->h;
  uVar72 = bottom_im2col->c;
  lVar48 = (long)(int)uVar72;
  iVar6 = top_blob->c;
  local_48 = 0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_8_ = 0;
  local_88._24_4_ = 0;
  local_88._32_8_ = (Allocator *)0x0;
  local_88._40_4_ = 0;
  local_88._44_4_ = 0;
  local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
  iVar31 = iVar47;
  uVar19 = uVar5;
  if (lVar48 < 4) {
    uVar23 = uVar72;
    if ((int)uVar5 < 4) {
      iVar49 = 1;
      sVar37 = 1;
      if ((int)uVar5 < 2) goto LAB_00204eaf;
      iVar31 = iVar47 * 2;
      uVar19 = (uVar5 & 1) + 1;
    }
    else {
      uVar19 = (uVar5 & 1) + (uVar5 >> 2) + (uint)((uVar5 >> 1 & 1) != 0);
      iVar31 = iVar47 * 4;
    }
    iVar49 = 1;
    sVar37 = 1;
  }
  else {
    if ((int)uVar5 < 4) {
      if ((int)uVar5 < 2) {
        iVar49 = 4;
        sVar37 = 4;
        uVar23 = (uVar72 & 3) + (uVar72 >> 2);
        goto LAB_00204eaf;
      }
      iVar31 = iVar47 * 2;
      uVar23 = (uVar72 & 3) + (uVar72 >> 2);
      uVar19 = (uVar5 & 1) + 1;
    }
    else {
      iVar31 = iVar47 * 4;
      uVar23 = (uVar72 & 3) + (uVar72 >> 2);
      uVar19 = (uVar5 & 1) + (uVar5 >> 2) + (uint)((uVar5 >> 1 & 1) != 0);
    }
    iVar49 = 4;
    sVar37 = 4;
  }
LAB_00204eaf:
  Mat::create((Mat *)local_88,iVar31,uVar23,uVar19,sVar37,iVar49,(Allocator *)opt);
  uVar30 = (ulong)uVar72;
  uVar20 = (ulong)(int)uVar5;
  uVar19 = (int)uVar5 >> 2;
  if (0 < (int)uVar19) {
    local_40 = (ulong)uVar19;
    local_d0 = 1;
    lVar39 = 3;
    uVar28 = 0;
    do {
      puVar43 = (undefined1 *)(local_48 * uVar28 * local_88._16_8_ + local_88._0_8_);
      if ((int)uVar72 < 4) {
        uVar25 = 0;
      }
      else {
        lVar45 = 3;
        lVar27 = 2;
        lVar50 = 1;
        uVar29 = 0;
        do {
          if (0 < iVar47) {
            lVar21 = bottom_im2col->cstep * bottom_im2col->elemsize;
            lVar35 = lVar21 * lVar45;
            lVar40 = (long)bottom_im2col->data + local_d0;
            lVar24 = lVar21 * lVar27;
            lVar32 = lVar21 * uVar29;
            lVar21 = lVar21 * lVar50;
            iVar31 = iVar47;
            do {
              *puVar43 = *(undefined1 *)(lVar40 + -1 + lVar32);
              puVar43[1] = *(undefined1 *)(lVar40 + -1 + lVar21);
              puVar43[2] = *(undefined1 *)(lVar40 + -1 + lVar24);
              puVar43[3] = *(undefined1 *)(lVar40 + -1 + lVar35);
              puVar43[4] = *(undefined1 *)(lVar40 + lVar32);
              puVar43[5] = *(undefined1 *)(lVar40 + lVar21);
              puVar43[6] = *(undefined1 *)(lVar40 + lVar24);
              puVar43[7] = *(undefined1 *)(lVar40 + lVar35);
              puVar43[8] = *(undefined1 *)(lVar40 + 1 + lVar32);
              puVar43[9] = *(undefined1 *)(lVar40 + 1 + lVar21);
              puVar43[10] = *(undefined1 *)(lVar40 + 1 + lVar24);
              puVar43[0xb] = *(undefined1 *)(lVar40 + 1 + lVar35);
              puVar43[0xc] = *(undefined1 *)(lVar40 + 2 + lVar32);
              puVar43[0xd] = *(undefined1 *)(lVar40 + 2 + lVar21);
              puVar43[0xe] = *(undefined1 *)(lVar40 + 2 + lVar24);
              puVar43[0xf] = *(undefined1 *)(lVar40 + 2 + lVar35);
              puVar43 = puVar43 + 0x10;
              lVar40 = lVar40 + (ulong)uVar5;
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          uVar25 = uVar29 + 4;
          lVar21 = uVar29 + 7;
          lVar45 = lVar45 + 4;
          lVar27 = lVar27 + 4;
          lVar50 = lVar50 + 4;
          uVar29 = uVar25;
          local_38 = uVar28;
        } while (lVar21 < lVar48);
      }
      if ((int)uVar25 < (int)uVar72) {
        uVar25 = uVar25 & 0xffffffff;
        do {
          if (0 < iVar47) {
            puVar22 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + lVar39);
            iVar31 = iVar47;
            do {
              *puVar43 = puVar22[-3];
              puVar43[1] = puVar22[-2];
              puVar43[2] = puVar22[-1];
              puVar43[3] = *puVar22;
              puVar43 = puVar43 + 4;
              puVar22 = puVar22 + uVar5;
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar30);
      }
      uVar28 = uVar28 + 1;
      local_d0 = local_d0 + 4;
      lVar39 = lVar39 + 4;
    } while (uVar28 != local_40);
  }
  uVar28 = uVar20 & 0xfffffffffffffffc;
  uVar23 = uVar5 >> 1 & 1;
  if (uVar23 != 0) {
    puVar43 = (undefined1 *)((long)(int)uVar19 * local_48 * local_88._16_8_ + local_88._0_8_);
    uVar25 = 0;
    if (3 < (int)uVar72) {
      lVar39 = 1;
      lVar27 = 2;
      lVar45 = 3;
      uVar29 = 0;
      do {
        if (0 < iVar47) {
          pvVar7 = bottom_im2col->data;
          lVar24 = bottom_im2col->cstep * bottom_im2col->elemsize;
          lVar21 = (long)pvVar7 + lVar24 * uVar29 + 1;
          lVar50 = (long)pvVar7 + lVar24 * lVar39 + 1;
          lVar32 = (long)pvVar7 + lVar24 * lVar27 + 1;
          lVar24 = (long)pvVar7 + lVar24 * lVar45 + 1;
          iVar31 = iVar47;
          do {
            *puVar43 = *(undefined1 *)(lVar21 + -1 + uVar28);
            puVar43[1] = *(undefined1 *)(lVar50 + -1 + uVar28);
            puVar43[2] = *(undefined1 *)(lVar32 + -1 + uVar28);
            puVar43[3] = *(undefined1 *)(lVar24 + -1 + uVar28);
            puVar43[4] = *(undefined1 *)(lVar21 + uVar28);
            puVar43[5] = *(undefined1 *)(lVar50 + uVar28);
            puVar43[6] = *(undefined1 *)(lVar32 + uVar28);
            puVar43[7] = *(undefined1 *)(lVar24 + uVar28);
            puVar43 = puVar43 + 8;
            lVar21 = lVar21 + uVar20;
            lVar50 = lVar50 + uVar20;
            lVar32 = lVar32 + uVar20;
            lVar24 = lVar24 + uVar20;
            iVar31 = iVar31 + -1;
          } while (iVar31 != 0);
        }
        uVar25 = uVar29 + 4;
        lVar50 = uVar29 + 7;
        lVar39 = lVar39 + 4;
        lVar27 = lVar27 + 4;
        lVar45 = lVar45 + 4;
        uVar29 = uVar25;
      } while (lVar50 < lVar48);
    }
    if ((int)uVar25 < (int)uVar72) {
      uVar25 = uVar25 & 0xffffffff;
      do {
        if (0 < iVar47) {
          puVar22 = (undefined1 *)
                    ((long)bottom_im2col->data +
                    bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + uVar28 + 1);
          iVar31 = iVar47;
          do {
            *puVar43 = puVar22[-1];
            puVar43[1] = *puVar22;
            puVar43 = puVar43 + 2;
            puVar22 = puVar22 + uVar20;
            iVar31 = iVar31 + -1;
          } while (iVar31 != 0);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar30);
    }
  }
  iVar31 = (int)uVar28 + uVar23 * 2;
  if (iVar31 < (int)uVar5) {
    uVar28 = (ulong)iVar31;
    do {
      iVar31 = (int)uVar28;
      iVar49 = iVar31 + 3;
      if (-1 < iVar31) {
        iVar49 = iVar31;
      }
      puVar43 = (undefined1 *)
                ((long)(int)((iVar31 - (((uint)(uVar28 >> 0x1f) & 1) + iVar31 & 0xfffffffe)) +
                             (iVar49 >> 2) +
                            (int)((char)((char)uVar28 - ((byte)iVar49 & 0xfc)) / '\x02')) * local_48
                 * local_88._16_8_ + local_88._0_8_);
      if ((int)uVar72 < 4) {
        uVar25 = 0;
      }
      else {
        lVar39 = 1;
        lVar27 = 2;
        lVar45 = 3;
        uVar29 = 0;
        do {
          if (0 < iVar47) {
            lVar50 = bottom_im2col->cstep * bottom_im2col->elemsize;
            lVar21 = (long)bottom_im2col->data + uVar28;
            iVar31 = iVar47;
            do {
              *puVar43 = *(undefined1 *)(lVar21 + lVar50 * uVar29);
              puVar43[1] = *(undefined1 *)(lVar21 + lVar50 * lVar39);
              puVar43[2] = *(undefined1 *)(lVar21 + lVar50 * lVar27);
              puVar43[3] = *(undefined1 *)(lVar21 + lVar50 * lVar45);
              puVar43 = puVar43 + 4;
              lVar21 = lVar21 + uVar20;
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          uVar25 = uVar29 + 4;
          lVar50 = uVar29 + 7;
          lVar39 = lVar39 + 4;
          lVar27 = lVar27 + 4;
          lVar45 = lVar45 + 4;
          uVar29 = uVar25;
        } while (lVar50 < lVar48);
      }
      if ((int)uVar25 < (int)uVar72) {
        uVar25 = uVar25 & 0xffffffff;
        do {
          if (0 < iVar47) {
            puVar22 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar28 + bottom_im2col->cstep * uVar25 * bottom_im2col->elemsize);
            iVar31 = iVar47;
            do {
              *puVar43 = *puVar22;
              puVar43 = puVar43 + 1;
              puVar22 = puVar22 + uVar20;
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar30);
      }
      uVar28 = uVar28 + 1;
    } while ((long)uVar28 < (long)uVar20);
  }
  if (0 < iVar6 >> 2) {
    uVar19 = uVar72 + 3;
    if (-1 < (int)uVar72) {
      uVar19 = uVar72;
    }
    iVar49 = ((int)uVar19 >> 2) * iVar47;
    iVar31 = ((int)uVar72 % 4) * iVar47;
    uVar30 = 0;
    do {
      sVar37 = top_blob->cstep;
      pvVar7 = top_blob->data;
      sVar8 = top_blob->elemsize;
      pauVar38 = (undefined1 (*) [16])(uVar30 * 4 * sVar37 * sVar8 + (long)pvVar7);
      pauVar41 = (undefined1 (*) [16])((uVar30 * 4 + 1) * sVar37 * sVar8 + (long)pvVar7);
      pauVar44 = (undefined1 (*) [16])((uVar30 * 4 + 2) * sVar37 * sVar8 + (long)pvVar7);
      pauVar46 = (undefined1 (*) [16])((uVar30 * 4 + 3) * sVar37 * sVar8 + (long)pvVar7);
      if ((int)uVar5 < 4) {
        uVar28 = 0;
      }
      else {
        uVar25 = 0;
        do {
          pauVar52 = (undefined1 (*) [16])
                     ((uVar25 >> 2) * local_48 * local_88._16_8_ + local_88._0_8_);
          pauVar36 = (undefined1 (*) [16])
                     (kernel->cstep * uVar30 * kernel->elemsize + (long)kernel->data);
          if (iVar49 < 1) {
            auVar69 = ZEXT1664((undefined1  [16])0x0);
            auVar68 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar68 = ZEXT1664((undefined1  [16])0x0);
            auVar69 = ZEXT1664((undefined1  [16])0x0);
            auVar78 = ZEXT1664((undefined1  [16])0x0);
            auVar81 = ZEXT1664((undefined1  [16])0x0);
            auVar85 = ZEXT1664((undefined1  [16])0x0);
            auVar71 = ZEXT1664((undefined1  [16])0x0);
            auVar76 = ZEXT1664((undefined1  [16])0x0);
            auVar84 = ZEXT1664((undefined1  [16])0x0);
            iVar26 = iVar49;
            do {
              auVar67 = vpmovsxbw_avx2(*pauVar52);
              auVar14 = vpermq_avx2(auVar67,0x50);
              auVar65 = vpermq_avx2(auVar67,0xfa);
              auVar83 = vpmovsxbw_avx2(*pauVar36);
              auVar15 = vpermq_avx2(auVar67,5);
              auVar67 = vpermq_avx2(auVar67,0xaf);
              auVar63 = vpmullw_avx2(auVar14,auVar83);
              auVar14 = vpmulhw_avx2(auVar14,auVar83);
              auVar64 = vpmullw_avx2(auVar15,auVar83);
              auVar15 = vpmulhw_avx2(auVar15,auVar83);
              auVar61 = vpmullw_avx512vl(auVar65,auVar83);
              auVar65 = vpmulhw_avx2(auVar65,auVar83);
              auVar62 = vpmullw_avx512vl(auVar67,auVar83);
              auVar66 = vpmulhw_avx2(auVar67,auVar83);
              auVar67 = vpunpcklwd_avx2(auVar63,auVar14);
              auVar67 = vpaddd_avx2(auVar67,auVar68._0_32_);
              auVar68 = ZEXT3264(auVar67);
              auVar83 = vpunpcklwd_avx2(auVar64,auVar15);
              auVar83 = vpaddd_avx2(auVar83,auVar78._0_32_);
              auVar78 = ZEXT3264(auVar83);
              auVar14 = vpunpckhwd_avx2(auVar63,auVar14);
              auVar14 = vpaddd_avx2(auVar14,auVar81._0_32_);
              auVar81 = ZEXT3264(auVar14);
              auVar15 = vpunpckhwd_avx2(auVar64,auVar15);
              auVar15 = vpaddd_avx2(auVar85._0_32_,auVar15);
              auVar85 = ZEXT3264(auVar15);
              auVar63 = vpunpcklwd_avx512vl(auVar61,auVar65);
              auVar63 = vpaddd_avx2(auVar63,auVar69._0_32_);
              auVar69 = ZEXT3264(auVar63);
              auVar64 = vpunpcklwd_avx512vl(auVar62,auVar66);
              auVar64 = vpaddd_avx2(auVar64,auVar71._0_32_);
              auVar71 = ZEXT3264(auVar64);
              auVar65 = vpunpckhwd_avx512vl(auVar61,auVar65);
              auVar65 = vpaddd_avx2(auVar65,auVar76._0_32_);
              auVar76 = ZEXT3264(auVar65);
              auVar66 = vpunpckhwd_avx512vl(auVar62,auVar66);
              auVar66 = vpaddd_avx2(auVar66,auVar84._0_32_);
              auVar84 = ZEXT3264(auVar66);
              pauVar52 = pauVar52 + 1;
              pauVar36 = pauVar36 + 1;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
            auVar61 = vpunpckldq_avx2(auVar67,auVar83);
            auVar62 = vpunpckldq_avx2(auVar14,auVar15);
            auVar83 = vpunpckhdq_avx2(auVar67,auVar83);
            auVar14 = vpunpckhdq_avx2(auVar14,auVar15);
            auVar12 = vpunpckldq_avx2(auVar63,auVar64);
            auVar13 = vpunpckldq_avx2(auVar65,auVar66);
            auVar15 = vpunpckhdq_avx2(auVar63,auVar64);
            auVar63 = vpunpckhdq_avx2(auVar65,auVar66);
            auVar67 = vpunpckhdq_avx2(auVar61,auVar62);
            auVar64 = vpermq_avx2(auVar67,0x9c);
            auVar67 = vpunpckldq_avx2(auVar61,auVar62);
            auVar67 = vpermq_avx2(auVar67,0x9c);
            auVar67 = vpaddd_avx2(auVar67,auVar64);
            auVar64 = vpunpckhdq_avx2(auVar83,auVar14);
            auVar64 = vpermq_avx2(auVar64,0x9c);
            auVar83 = vpunpckldq_avx2(auVar83,auVar14);
            auVar83 = vpermq_avx2(auVar83,0x9c);
            auVar83 = vpaddd_avx2(auVar64,auVar83);
            auVar67 = vpaddd_avx2(auVar67,auVar83);
            auVar68 = ZEXT3264(auVar67);
            auVar67 = vpunpckhdq_avx2(auVar12,auVar13);
            auVar83 = vpermq_avx2(auVar67,0x9c);
            auVar67 = vpunpckldq_avx2(auVar12,auVar13);
            auVar67 = vpermq_avx2(auVar67,0x9c);
            auVar67 = vpaddd_avx2(auVar67,auVar83);
            auVar83 = vpunpckhdq_avx2(auVar15,auVar63);
            auVar14 = vpermq_avx2(auVar83,0x9c);
            auVar83 = vpunpckldq_avx2(auVar15,auVar63);
            auVar83 = vpermq_avx2(auVar83,0x9c);
            auVar83 = vpaddd_avx2(auVar14,auVar83);
            auVar67 = vpaddd_avx2(auVar67,auVar83);
            auVar69 = ZEXT3264(auVar67);
          }
          auVar56 = auVar69._0_16_;
          auVar58 = auVar68._0_16_;
          auVar57 = auVar68._16_16_;
          auVar70 = auVar69._16_16_;
          if (0 < iVar31) {
            lVar48 = 0;
            do {
              auVar58._8_8_ = 0;
              auVar58._0_8_ = *(ulong *)(*pauVar52 + lVar48 * 4);
              auVar58 = vpmovsxbw_avx(auVar58);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = *(ulong *)(*pauVar36 + lVar48 * 4);
              auVar56 = vpmovsxbw_avx(auVar56);
              auVar74 = vpshuflw_avx(auVar58,0x50);
              auVar74 = vpshufd_avx(auVar74,0x50);
              auVar79._0_8_ = auVar56._0_8_;
              auVar79._8_8_ = auVar79._0_8_;
              auVar77 = vpmullw_avx(auVar74,auVar79);
              auVar56 = vpmulhw_avx(auVar74,auVar79);
              auVar58 = vpshuflw_avx(auVar58,0xfa);
              auVar58 = vpshufd_avx(auVar58,0x50);
              auVar11 = vpmullw_avx(auVar58,auVar79);
              auVar74 = vpmulhw_avx(auVar58,auVar79);
              auVar58 = vpunpcklwd_avx(auVar77,auVar56);
              auVar58 = vpaddd_avx(auVar68._0_16_,auVar58);
              auVar68 = ZEXT1664(auVar58);
              auVar56 = vpunpckhwd_avx(auVar77,auVar56);
              auVar57 = vpaddd_avx(auVar57,auVar56);
              auVar56 = vpunpcklwd_avx(auVar11,auVar74);
              auVar56 = vpaddd_avx(auVar69._0_16_,auVar56);
              auVar69 = ZEXT1664(auVar56);
              auVar74 = vpunpckhwd_avx(auVar11,auVar74);
              auVar70 = vpaddd_avx(auVar70,auVar74);
              lVar48 = lVar48 + 1;
            } while (iVar31 != (int)lVar48);
          }
          auVar74 = vpunpckldq_avx(auVar58,auVar57);
          auVar77 = vpunpckldq_avx(auVar56,auVar70);
          auVar58 = vpunpckhdq_avx(auVar58,auVar57);
          auVar57 = vpunpckhdq_avx(auVar56,auVar70);
          auVar70 = vpunpcklqdq_avx(auVar74,auVar77);
          auVar56 = vpunpckhqdq_avx(auVar74,auVar77);
          auVar74 = vpunpcklqdq_avx(auVar58,auVar57);
          auVar58 = vpunpckhqdq_avx(auVar58,auVar57);
          *pauVar38 = auVar70;
          *pauVar41 = auVar56;
          *pauVar44 = auVar74;
          *pauVar46 = auVar58;
          pauVar38 = pauVar38 + 1;
          pauVar41 = pauVar41 + 1;
          pauVar44 = pauVar44 + 1;
          pauVar46 = pauVar46 + 1;
          uVar28 = uVar25 + 4;
          lVar48 = uVar25 + 7;
          uVar25 = uVar28;
        } while (lVar48 < (long)uVar20);
      }
      uVar19 = (uint)uVar28;
      if ((int)(uVar19 | 1) < (int)uVar5) {
        pauVar36 = (undefined1 (*) [16])
                   (kernel->cstep * uVar30 * kernel->elemsize + (long)kernel->data);
        do {
          uVar23 = (uint)uVar28;
          pauVar33 = (undefined1 (*) [16])
                     ((ulong)(((uint)(uVar28 >> 2) & 0x3fffffff) + (uint)((uVar23 >> 1 & 1) != 0)) *
                      local_48 * local_88._16_8_ + local_88._0_8_);
          auVar68 = ZEXT1664((undefined1  [16])0x0);
          pauVar52 = pauVar36;
          if (0 < iVar49) {
            auVar69 = ZEXT1664((undefined1  [16])0x0);
            auVar71 = ZEXT1664((undefined1  [16])0x0);
            auVar76 = ZEXT1664((undefined1  [16])0x0);
            iVar26 = iVar49;
            do {
              auVar67 = vpmovsxbw_avx2(*pauVar33);
              auVar14 = vpermq_avx2(auVar67,0x50);
              auVar83 = vpmovsxbw_avx2(*pauVar52);
              auVar67 = vpermq_avx2(auVar67,5);
              auVar63 = vpmullw_avx2(auVar14,auVar83);
              auVar14 = vpmulhw_avx2(auVar14,auVar83);
              auVar64 = vpmullw_avx2(auVar67,auVar83);
              auVar15 = vpmulhw_avx2(auVar67,auVar83);
              auVar67 = vpunpcklwd_avx2(auVar63,auVar14);
              auVar67 = vpaddd_avx2(auVar68._0_32_,auVar67);
              auVar68 = ZEXT3264(auVar67);
              auVar83 = vpunpcklwd_avx2(auVar64,auVar15);
              auVar83 = vpaddd_avx2(auVar69._0_32_,auVar83);
              auVar69 = ZEXT3264(auVar83);
              auVar14 = vpunpckhwd_avx2(auVar63,auVar14);
              auVar14 = vpaddd_avx2(auVar71._0_32_,auVar14);
              auVar71 = ZEXT3264(auVar14);
              auVar15 = vpunpckhwd_avx2(auVar64,auVar15);
              auVar15 = vpaddd_avx2(auVar76._0_32_,auVar15);
              auVar76 = ZEXT3264(auVar15);
              pauVar33 = (undefined1 (*) [16])(*pauVar33 + 8);
              pauVar52 = pauVar52 + 1;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
            auVar63 = vpunpckldq_avx2(auVar67,auVar83);
            auVar64 = vpunpckldq_avx2(auVar14,auVar15);
            auVar83 = vpunpckhdq_avx2(auVar67,auVar83);
            auVar14 = vpunpckhdq_avx2(auVar14,auVar15);
            auVar67 = vpunpckhdq_avx2(auVar63,auVar64);
            auVar15 = vpermq_avx2(auVar67,0x9c);
            auVar67 = vpunpckldq_avx2(auVar63,auVar64);
            auVar67 = vpermq_avx2(auVar67,0x9c);
            auVar67 = vpaddd_avx2(auVar67,auVar15);
            auVar15 = vpunpckhdq_avx2(auVar83,auVar14);
            auVar15 = vpermq_avx2(auVar15,0x9c);
            auVar83 = vpunpckldq_avx2(auVar83,auVar14);
            auVar83 = vpermq_avx2(auVar83,0x9c);
            auVar83 = vpaddd_avx2(auVar15,auVar83);
            auVar67 = vpaddd_avx2(auVar67,auVar83);
            auVar68 = ZEXT3264(auVar67);
          }
          auVar58 = auVar68._0_16_;
          auVar57 = auVar68._16_16_;
          if (0 < iVar31) {
            lVar48 = 0;
            do {
              auVar58 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar33 + lVar48 * 2)));
              auVar58 = vpshuflw_avx(auVar58,0x50);
              auVar56 = vpshufd_avx(auVar58,0x50);
              auVar70._8_8_ = 0;
              auVar70._0_8_ = *(ulong *)(*pauVar52 + lVar48 * 4);
              auVar58 = vpmovsxbw_avx(auVar70);
              auVar74._0_8_ = auVar58._0_8_;
              auVar74._8_8_ = auVar74._0_8_;
              auVar70 = vpmullw_avx(auVar56,auVar74);
              auVar56 = vpmulhw_avx(auVar56,auVar74);
              auVar58 = vpunpcklwd_avx(auVar70,auVar56);
              auVar58 = vpaddd_avx(auVar68._0_16_,auVar58);
              auVar68 = ZEXT1664(auVar58);
              auVar56 = vpunpckhwd_avx(auVar70,auVar56);
              auVar57 = vpaddd_avx(auVar57,auVar56);
              lVar48 = lVar48 + 1;
            } while (iVar31 != (int)lVar48);
          }
          *(int *)*pauVar38 = auVar58._0_4_;
          *(int *)*pauVar41 = auVar58._4_4_;
          *(int *)*pauVar44 = auVar58._8_4_;
          *(int *)*pauVar46 = auVar58._12_4_;
          *(int *)(*pauVar38 + 4) = auVar57._0_4_;
          *(int *)(*pauVar41 + 4) = auVar57._4_4_;
          *(int *)(*pauVar44 + 4) = auVar57._8_4_;
          *(int *)(*pauVar46 + 4) = auVar57._12_4_;
          pauVar38 = (undefined1 (*) [16])(*pauVar38 + 8);
          pauVar41 = (undefined1 (*) [16])(*pauVar41 + 8);
          pauVar44 = (undefined1 (*) [16])(*pauVar44 + 8);
          pauVar46 = (undefined1 (*) [16])(*pauVar46 + 8);
          uVar19 = uVar23 + 2;
          uVar28 = (ulong)uVar19;
        } while ((int)(uVar23 + 3) < (int)uVar5);
      }
      if ((int)uVar19 < (int)uVar5) {
        pauVar36 = (undefined1 (*) [16])
                   (kernel->cstep * uVar30 * kernel->elemsize + (long)kernel->data);
        do {
          puVar53 = (ulong *)((ulong)((uVar19 & 1) + (uVar19 >> 2) + (uint)((uVar19 >> 1 & 1) != 0))
                              * local_48 * local_88._16_8_ + local_88._0_8_);
          auVar68 = ZEXT1664((undefined1  [16])0x0);
          pauVar52 = pauVar36;
          if (0 < iVar49) {
            auVar69 = ZEXT1664((undefined1  [16])0x0);
            auVar71 = ZEXT1664((undefined1  [16])0x0);
            auVar76 = ZEXT1664((undefined1  [16])0x0);
            iVar26 = iVar49;
            do {
              auVar57._8_8_ = 0;
              auVar57._0_8_ = *puVar53;
              auVar56 = vpmovsxbw_avx(auVar57);
              auVar58 = *pauVar52;
              auVar57 = vpcmpgtb_avx((undefined1  [16])0x0,auVar58);
              auVar70 = vpunpcklbw_avx(auVar58,auVar57);
              auVar58 = vpunpckhbw_avx(auVar58,auVar57);
              auVar77._0_8_ = auVar56._0_8_;
              auVar77._8_8_ = auVar77._0_8_;
              auVar56 = vpmullw_avx(auVar70,auVar77);
              auVar57 = vpmulhw_avx(auVar70,auVar77);
              auVar74 = vpmullw_avx(auVar77,auVar58);
              auVar70 = vpmulhw_avx(auVar77,auVar58);
              auVar58 = vpunpcklwd_avx(auVar56,auVar57);
              auVar58 = vpaddd_avx(auVar76._0_16_,auVar58);
              auVar76 = ZEXT1664(auVar58);
              auVar57 = vpunpckhwd_avx(auVar56,auVar57);
              auVar57 = vpaddd_avx(auVar71._0_16_,auVar57);
              auVar71 = ZEXT1664(auVar57);
              auVar56 = vpunpcklwd_avx(auVar74,auVar70);
              auVar56 = vpaddd_avx(auVar69._0_16_,auVar56);
              auVar69 = ZEXT1664(auVar56);
              auVar70 = vpunpckhwd_avx(auVar74,auVar70);
              auVar70 = vpaddd_avx(auVar68._0_16_,auVar70);
              auVar68 = ZEXT1664(auVar70);
              puVar53 = (ulong *)((long)puVar53 + 4);
              pauVar52 = pauVar52 + 1;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
            auVar74 = vpunpckldq_avx(auVar58,auVar57);
            auVar77 = vpunpckldq_avx(auVar56,auVar70);
            auVar57 = vpunpckhdq_avx(auVar58,auVar57);
            auVar56 = vpunpckhdq_avx(auVar56,auVar70);
            auVar70 = vpunpcklqdq_avx(auVar74,auVar77);
            auVar58 = vpunpckhqdq_avx(auVar74,auVar77);
            auVar58 = vpaddd_avx(auVar70,auVar58);
            auVar70 = vpunpcklqdq_avx(auVar57,auVar56);
            auVar57 = vpunpckhqdq_avx(auVar57,auVar56);
            auVar57 = vpaddd_avx(auVar57,auVar70);
            auVar58 = vpaddd_avx(auVar58,auVar57);
            auVar68 = ZEXT1664(auVar58);
          }
          auVar58 = auVar68._0_16_;
          if (0 < iVar31) {
            lVar48 = 0;
            do {
              auVar56 = vpbroadcastw_avx512vl();
              auVar11._8_8_ = 0;
              auVar11._0_8_ = *(ulong *)(*pauVar52 + lVar48 * 4);
              auVar58 = vpmovsxbw_avx(auVar11);
              auVar57 = vpmullw_avx(auVar56,auVar58);
              auVar58 = vpmulhw_avx(auVar56,auVar58);
              auVar58 = vpunpcklwd_avx(auVar57,auVar58);
              auVar58 = vpaddd_avx(auVar68._0_16_,auVar58);
              auVar68 = ZEXT1664(auVar58);
              lVar48 = lVar48 + 1;
            } while (iVar31 != (int)lVar48);
          }
          *(int *)*pauVar38 = auVar58._0_4_;
          *(int *)*pauVar41 = auVar58._4_4_;
          *(int *)*pauVar44 = auVar58._8_4_;
          *(int *)*pauVar46 = auVar58._12_4_;
          pauVar38 = (undefined1 (*) [16])(*pauVar38 + 4);
          pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
          pauVar44 = (undefined1 (*) [16])(*pauVar44 + 4);
          pauVar46 = (undefined1 (*) [16])(*pauVar46 + 4);
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar5);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != (uint)(iVar6 >> 2));
  }
  uVar30 = (long)iVar6 & 0xfffffffffffffffc;
  if ((int)uVar30 != iVar6) {
    pvVar7 = top_blob->data;
    sVar37 = top_blob->cstep;
    sVar8 = top_blob->elemsize;
    lVar39 = local_48 * local_88._16_8_;
    pvVar9 = kernel->data;
    lVar48 = kernel->cstep * kernel->elemsize;
    uVar19 = uVar72 + 3;
    if (-1 < (int)uVar72) {
      uVar19 = uVar72;
    }
    iVar31 = ((int)uVar19 >> 2) * iVar47;
    iVar47 = ((int)uVar72 % 4) * iVar47;
    auVar68 = vpbroadcastq_avx512f();
    auVar69 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar71 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pauVar38 = (undefined1 (*) [16])(sVar37 * sVar8 * uVar30 + (long)pvVar7);
      uVar72 = (uint)uVar30;
      if ((int)uVar5 < 4) {
        uVar28 = 0;
      }
      else {
        uVar19 = uVar72 + 3;
        if (-1 < (int)uVar72) {
          uVar19 = uVar72;
        }
        uVar25 = 0;
        do {
          pauVar41 = (undefined1 (*) [16])((uVar25 >> 2) * lVar39 + local_88._0_8_);
          if (iVar31 < 1) {
            auVar76 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar76 = ZEXT1664((undefined1  [16])0x0);
            auVar78 = ZEXT1664((undefined1  [16])0x0);
            puVar53 = (ulong *)((int)(((int)uVar19 >> 2) + (uVar72 - (uVar19 & 0xfffffffc))) *
                                lVar48 + (long)pvVar9);
            iVar49 = iVar31;
            do {
              auVar67 = vpmovsxbw_avx2(*pauVar41);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *puVar53;
              auVar58 = vpmovsxbw_avx(auVar1);
              auVar83._0_8_ = auVar58._0_8_;
              auVar83._8_8_ = auVar83._0_8_;
              auVar83._16_8_ = auVar83._0_8_;
              auVar83._24_8_ = auVar83._0_8_;
              auVar14 = vpmullw_avx2(auVar83,auVar67);
              auVar83 = vpmulhw_avx2(auVar67,auVar83);
              auVar67 = vpunpcklwd_avx2(auVar14,auVar83);
              auVar67 = vpaddd_avx2(auVar78._0_32_,auVar67);
              auVar78 = ZEXT3264(auVar67);
              auVar83 = vpunpckhwd_avx2(auVar14,auVar83);
              auVar83 = vpaddd_avx2(auVar76._0_32_,auVar83);
              auVar76 = ZEXT3264(auVar83);
              pauVar41 = pauVar41 + 1;
              puVar53 = (ulong *)((long)puVar53 + 4);
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
            auVar58 = vpshufd_avx(auVar67._0_16_,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar67._0_16_);
            auVar57 = vpshufd_avx(auVar83._0_16_,0xee);
            auVar57 = vpaddd_avx(auVar57,auVar83._0_16_);
            auVar57 = vphaddd_avx(auVar58,auVar57);
            auVar58 = vpshufd_avx(auVar67._16_16_,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar67._16_16_);
            auVar56 = vphaddd_avx(auVar58,auVar58);
            auVar58 = vpshufd_avx(auVar83._16_16_,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar83._16_16_);
            auVar58 = vphaddd_avx(auVar58,auVar58);
            auVar57 = vpshufd_avx(auVar57,0xe8);
            auVar57 = vpunpcklqdq_avx(auVar57,auVar56);
            auVar75._0_4_ = auVar58._0_4_;
            auVar75._4_4_ = auVar75._0_4_;
            auVar75._8_4_ = auVar75._0_4_;
            auVar75._12_4_ = auVar75._0_4_;
            auVar58 = vpblendd_avx2(auVar57,auVar75,8);
            auVar76 = ZEXT1664(auVar58);
          }
          auVar58 = auVar76._0_16_;
          if (0 < iVar47) {
            lVar27 = 0;
            do {
              auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(*pauVar41 + lVar27 * 4)));
              auVar57 = vpbroadcastd_avx512vl();
              auVar58 = vpmulld_avx(auVar57,auVar58);
              auVar58 = vpaddd_avx(auVar58,auVar76._0_16_);
              auVar76 = ZEXT1664(auVar58);
              lVar27 = lVar27 + 1;
            } while (iVar47 != (int)lVar27);
          }
          *pauVar38 = auVar58;
          pauVar38 = pauVar38 + 1;
          uVar28 = uVar25 + 4;
          lVar27 = uVar25 + 7;
          uVar25 = uVar28;
        } while (lVar27 < (long)uVar20);
      }
      uVar19 = (uint)uVar28;
      if ((int)(uVar19 | 1) < (int)uVar5) {
        uVar23 = uVar72 + 3;
        if (-1 < (int)uVar72) {
          uVar23 = uVar72;
        }
        do {
          uVar51 = (uint)uVar28;
          puVar53 = (ulong *)((ulong)(((uint)(uVar28 >> 2) & 0x3fffffff) +
                                     (uint)((uVar51 >> 1 & 1) != 0)) * lVar39 + local_88._0_8_);
          auVar76 = ZEXT1664((undefined1  [16])0x0);
          if (0 < iVar31) {
            auVar78 = ZEXT1664((undefined1  [16])0x0);
            puVar34 = (ulong *)((int)(((int)uVar23 >> 2) + (uVar72 - (uVar23 & 0xfffffffc))) *
                                lVar48 + (long)pvVar9);
            iVar49 = iVar31;
            do {
              auVar80._8_8_ = 0;
              auVar80._0_8_ = *puVar53;
              auVar58 = vpcmpgtb_avx((undefined1  [16])0x0,auVar80);
              auVar57 = vpunpcklbw_avx(auVar80,auVar58);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *puVar34;
              auVar58 = vpmovsxbw_avx(auVar2);
              auVar82._0_8_ = auVar58._0_8_;
              auVar82._8_8_ = auVar82._0_8_;
              auVar56 = vpmullw_avx(auVar82,auVar57);
              auVar57 = vpmulhw_avx(auVar57,auVar82);
              auVar58 = vpunpcklwd_avx(auVar56,auVar57);
              auVar58 = vpaddd_avx(auVar78._0_16_,auVar58);
              auVar78 = ZEXT1664(auVar58);
              auVar57 = vpunpckhwd_avx(auVar56,auVar57);
              auVar57 = vpaddd_avx(auVar76._0_16_,auVar57);
              auVar76 = ZEXT1664(auVar57);
              puVar53 = puVar53 + 1;
              puVar34 = (ulong *)((long)puVar34 + 4);
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
            auVar56 = vpshufd_avx(auVar58,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar56);
            auVar56 = vpshufd_avx(auVar57,0xee);
            auVar57 = vpaddd_avx(auVar57,auVar56);
            auVar58 = vphaddd_avx(auVar58,auVar57);
            auVar58 = vpshufd_avx(auVar58,0xe8);
            auVar76 = ZEXT1664(auVar58);
          }
          uVar73 = auVar76._0_8_;
          if (0 < iVar47) {
            lVar27 = 0;
            do {
              auVar58 = vpmovsxbd_avx(ZEXT216(*(ushort *)((long)puVar53 + lVar27 * 2)));
              auVar57 = vpbroadcastd_avx512vl();
              auVar58 = vpmulld_avx(auVar57,auVar58);
              auVar58 = vpaddd_avx(auVar58,auVar76._0_16_);
              auVar76 = ZEXT1664(auVar58);
              uVar73 = auVar58._0_8_;
              lVar27 = lVar27 + 1;
            } while (iVar47 != (int)lVar27);
          }
          *(undefined8 *)*pauVar38 = uVar73;
          pauVar38 = (undefined1 (*) [16])((long)*pauVar38 + 8);
          uVar19 = uVar51 + 2;
          uVar28 = (ulong)uVar19;
        } while ((int)(uVar51 + 3) < (int)uVar5);
      }
      if ((int)uVar19 < (int)uVar5) {
        uVar23 = uVar72 + 3;
        if (-1 < (int)uVar72) {
          uVar23 = uVar72;
        }
        pvVar42 = (void *)((int)(((int)uVar23 >> 2) + (uVar72 - (uVar23 & 0xfffffffc))) * lVar48 +
                          (long)pvVar9);
        do {
          if (iVar31 < 1) {
            lVar27 = (ulong)((uVar19 & 1) + (uVar19 >> 2) + (uint)((uVar19 >> 1 & 1) != 0)) * lVar39
            ;
            uVar72 = 0;
            pvVar54 = pvVar42;
          }
          else {
            lVar27 = (ulong)((uVar19 >> 2) + (uVar19 & 1) + (uint)((uVar19 >> 1 & 1) != 0)) * lVar39
            ;
            auVar76 = ZEXT1664((undefined1  [16])0x0);
            lVar45 = 0;
            lVar50 = 0;
            do {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(local_88._0_8_ + lVar50 * 4 + lVar27);
              auVar58 = vpmovsxbw_avx(auVar3);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)((long)pvVar42 + lVar50 * 4);
              auVar57 = vpmovsxbw_avx(auVar4);
              auVar56 = vpmullw_avx(auVar57,auVar58);
              auVar58 = vpmulhw_avx(auVar58,auVar57);
              auVar58 = vpunpcklwd_avx(auVar56,auVar58);
              auVar58 = vpaddd_avx(auVar76._0_16_,auVar58);
              auVar76 = ZEXT1664(auVar58);
              lVar50 = lVar50 + 1;
              lVar45 = lVar45 + -4;
            } while (iVar31 != (int)lVar50);
            auVar58 = vphaddd_avx(auVar58,auVar58);
            auVar58 = vphaddd_avx(auVar58,auVar58);
            uVar72 = auVar58._0_4_;
            lVar27 = lVar27 - lVar45;
            pvVar54 = (void *)((long)pvVar42 - lVar45);
          }
          if (0 < iVar47) {
            auVar76 = ZEXT464(uVar72);
            uVar28 = 0;
            do {
              auVar78 = vmovdqa64_avx512f(auVar76);
              auVar76 = vpbroadcastq_avx512f();
              auVar81 = vporq_avx512f(auVar76,auVar69);
              auVar76 = vporq_avx512f(auVar76,auVar71);
              uVar73 = vpcmpuq_avx512f(auVar76,auVar68,2);
              bVar16 = (byte)uVar73;
              uVar73 = vpcmpuq_avx512f(auVar81,auVar68,2);
              bVar17 = (byte)uVar73;
              uVar55 = CONCAT11(bVar17,bVar16);
              auVar58 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(local_88._0_8_ + uVar28 + lVar27));
              auVar59[1] = ((byte)(uVar55 >> 1) & 1) * auVar58[1];
              auVar59[0] = (bVar16 & 1) * auVar58[0];
              auVar59[2] = ((byte)(uVar55 >> 2) & 1) * auVar58[2];
              auVar59[3] = ((byte)(uVar55 >> 3) & 1) * auVar58[3];
              auVar59[4] = ((byte)(uVar55 >> 4) & 1) * auVar58[4];
              auVar59[5] = ((byte)(uVar55 >> 5) & 1) * auVar58[5];
              auVar59[6] = ((byte)(uVar55 >> 6) & 1) * auVar58[6];
              auVar59[7] = ((byte)(uVar55 >> 7) & 1) * auVar58[7];
              auVar59[8] = (bVar17 & 1) * auVar58[8];
              auVar59[9] = (bVar17 >> 1 & 1) * auVar58[9];
              auVar59[10] = (bVar17 >> 2 & 1) * auVar58[10];
              auVar59[0xb] = (bVar17 >> 3 & 1) * auVar58[0xb];
              auVar59[0xc] = (bVar17 >> 4 & 1) * auVar58[0xc];
              auVar59[0xd] = (bVar17 >> 5 & 1) * auVar58[0xd];
              auVar59[0xe] = (bVar17 >> 6 & 1) * auVar58[0xe];
              auVar59[0xf] = -((char)bVar17 >> 7) * auVar58[0xf];
              auVar58 = vmovdqu8_avx512vl(*(undefined1 (*) [16])((long)pvVar54 + uVar28));
              auVar60[1] = ((byte)(uVar55 >> 1) & 1) * auVar58[1];
              auVar60[0] = (bVar16 & 1) * auVar58[0];
              auVar60[2] = ((byte)(uVar55 >> 2) & 1) * auVar58[2];
              auVar60[3] = ((byte)(uVar55 >> 3) & 1) * auVar58[3];
              auVar60[4] = ((byte)(uVar55 >> 4) & 1) * auVar58[4];
              auVar60[5] = ((byte)(uVar55 >> 5) & 1) * auVar58[5];
              auVar60[6] = ((byte)(uVar55 >> 6) & 1) * auVar58[6];
              auVar60[7] = ((byte)(uVar55 >> 7) & 1) * auVar58[7];
              auVar60[8] = (bVar17 & 1) * auVar58[8];
              auVar60[9] = (bVar17 >> 1 & 1) * auVar58[9];
              auVar60[10] = (bVar17 >> 2 & 1) * auVar58[10];
              auVar60[0xb] = (bVar17 >> 3 & 1) * auVar58[0xb];
              auVar60[0xc] = (bVar17 >> 4 & 1) * auVar58[0xc];
              auVar60[0xd] = (bVar17 >> 5 & 1) * auVar58[0xd];
              auVar60[0xe] = (bVar17 >> 6 & 1) * auVar58[0xe];
              auVar60[0xf] = -((char)bVar17 >> 7) * auVar58[0xf];
              auVar76 = vpmovsxbd_avx512f(auVar59);
              auVar81 = vpmovsxbd_avx512f(auVar60);
              auVar76 = vpmulld_avx512f(auVar81,auVar76);
              auVar76 = vpaddd_avx512f(auVar76,auVar78);
              uVar28 = uVar28 + 0x10;
            } while ((iVar47 + 0xfU & 0xfffffff0) != uVar28);
            auVar76 = vmovdqa32_avx512f(auVar76);
            auVar81._0_4_ =
                 (uint)(bVar16 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar78._0_4_;
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar81._4_4_ = (uint)bVar10 * auVar76._4_4_ | (uint)!bVar10 * auVar78._4_4_;
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar81._8_4_ = (uint)bVar10 * auVar76._8_4_ | (uint)!bVar10 * auVar78._8_4_;
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar81._12_4_ = (uint)bVar10 * auVar76._12_4_ | (uint)!bVar10 * auVar78._12_4_;
            bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
            auVar81._16_4_ = (uint)bVar10 * auVar76._16_4_ | (uint)!bVar10 * auVar78._16_4_;
            bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
            auVar81._20_4_ = (uint)bVar10 * auVar76._20_4_ | (uint)!bVar10 * auVar78._20_4_;
            bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
            auVar81._24_4_ = (uint)bVar10 * auVar76._24_4_ | (uint)!bVar10 * auVar78._24_4_;
            bVar10 = (bool)((byte)(uVar55 >> 7) & 1);
            auVar81._28_4_ = (uint)bVar10 * auVar76._28_4_ | (uint)!bVar10 * auVar78._28_4_;
            auVar81._32_4_ =
                 (uint)(bVar17 & 1) * auVar76._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar78._32_4_;
            bVar10 = (bool)(bVar17 >> 1 & 1);
            auVar81._36_4_ = (uint)bVar10 * auVar76._36_4_ | (uint)!bVar10 * auVar78._36_4_;
            bVar10 = (bool)(bVar17 >> 2 & 1);
            auVar81._40_4_ = (uint)bVar10 * auVar76._40_4_ | (uint)!bVar10 * auVar78._40_4_;
            bVar10 = (bool)(bVar17 >> 3 & 1);
            auVar81._44_4_ = (uint)bVar10 * auVar76._44_4_ | (uint)!bVar10 * auVar78._44_4_;
            bVar10 = (bool)(bVar17 >> 4 & 1);
            auVar81._48_4_ = (uint)bVar10 * auVar76._48_4_ | (uint)!bVar10 * auVar78._48_4_;
            bVar10 = (bool)(bVar17 >> 5 & 1);
            auVar81._52_4_ = (uint)bVar10 * auVar76._52_4_ | (uint)!bVar10 * auVar78._52_4_;
            bVar10 = (bool)(bVar17 >> 6 & 1);
            auVar81._56_4_ = (uint)bVar10 * auVar76._56_4_ | (uint)!bVar10 * auVar78._56_4_;
            auVar81._60_4_ =
                 (uint)(bVar17 >> 7) * auVar76._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar78._60_4_;
            auVar67 = vextracti64x4_avx512f(auVar81,1);
            auVar76 = vpaddd_avx512f(auVar81,ZEXT3264(auVar67));
            auVar58 = vpaddd_avx(auVar76._0_16_,auVar76._16_16_);
            auVar57 = vpshufd_avx(auVar58,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar57);
            auVar57 = vpshufd_avx(auVar58,0x55);
            auVar58 = vpaddd_avx(auVar58,auVar57);
            uVar72 = auVar58._0_4_;
          }
          *(uint *)*pauVar38 = uVar72;
          pauVar38 = (undefined1 (*) [16])((long)*pauVar38 + 4);
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar5);
      }
      uVar30 = uVar30 + 1;
    } while ((long)uVar30 < (long)iVar6);
  }
  piVar18 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __SSE2__
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#else // __SSE2__
    tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            signed char* tmpptr = tmp.channel(i);

            int q = 0;
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#endif // __SSE2__

    int nn_outch = 0;
    int remain_outch_start = 0;

#if __SSE2__
    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
                __m256i _sum21_33 = _mm256_setzero_si256();
                __m256i _sum31_23 = _mm256_setzero_si256();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                    __m256i _sl20_31 = _mm256_mullo_epi16(_val23_16, _w01_16);
                    __m256i _sh20_31 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                    __m256i _sl30_21 = _mm256_mullo_epi16(_val32_16, _w01_16);
                    __m256i _sh30_21 = _mm256_mulhi_epi16(_val32_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_unpacklo_epi16(_sl20_31, _sh20_31));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_unpacklo_epi16(_sl30_21, _sh30_21));
                    _sum21_33 = _mm256_add_epi32(_sum21_33, _mm256_unpackhi_epi16(_sl20_31, _sh20_31));
                    _sum31_23 = _mm256_add_epi32(_sum31_23, _mm256_unpackhi_epi16(_sl30_21, _sh30_21));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum20_32, _sum30_22);
                    _tmp1 = _mm256_unpacklo_epi32(_sum21_33, _sum31_23);
                    _tmp2 = _mm256_unpackhi_epi32(_sum20_32, _sum30_22);
                    _tmp3 = _mm256_unpackhi_epi32(_sum21_33, _sum31_23);
                    _sum20_32 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum30_22 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum21_33 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum31_23 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum30_22);
                _sum21_33 = _mm256_add_epi32(_sum21_33, _sum31_23);
                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum21_33);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
                _sum20_32 = _mm256_permutevar8x32_epi32(_sum20_32, _perm_mask);
#endif
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val0123 = _mm_cvtepi8_epi16(_val0123);
#else
                __m128i _extval0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                _val0123 = _mm_unpacklo_epi8(_val0123, _extval0123);
#endif

                __m128i _val01 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(1, 1, 0, 0));

                _val01 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _val23 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(3, 3, 2, 2));

                _val23 = _mm_shuffle_epi32(_val23, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum10);
                _tmp1 = _mm_unpacklo_epi32(_sum20, _sum30);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum10);
                _tmp3 = _mm_unpackhi_epi32(_sum20, _sum30);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum10 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum20 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum30 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)outptr1, _sum10);
            _mm_storeu_si128((__m128i*)outptr2, _sum20);
            _mm_storeu_si128((__m128i*)outptr3, _sum30);
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
#endif
#else
#if __XOP__
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum02 = _mm_setzero_si128();
                __m128i _sum03 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
                __m128i _sum12 = _mm_setzero_si128();
                __m128i _sum13 = _mm_setzero_si128();
#endif
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                    __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                    __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                    __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                    __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);

                    _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl01, _sh01));
                    _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                    _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl10, _sh10));
                    _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl11, _sh11));
                    _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl11, _sh11));
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
#endif
#else
#if __XOP__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                    _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                    _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                    _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                    _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                    _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                    _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                    _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                    _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum02 = _mm_add_epi32(_sum02, _sum03);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
                _sum12 = _mm_add_epi32(_sum12, _sum13);

                _sum00 = _mm_add_epi32(_sum00, _sum02);
                _sum10 = _mm_add_epi32(_sum10, _sum12);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=99754
                // gcc incorrectly put 32bit to tail with _mm_loadu_si32  :(
                // 0 1 2 3 x x x x x x x x x x x x
                // x x x x x x x x x x x x 0 1 2 3
                // __m128i _w0123 = _mm_loadu_si32(kptr0);
                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __SSE2__
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;
            int sum2 = 0;
            int sum3 = 0;

            if (nn4 > 0)
            {
                __m256i _sum0_2 = _mm256_setzero_si256();
                __m256i _sum1_3 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
                    _w = _mm_unpacklo_epi64(_w, _w);
                    __m256i _ww = _mm256_inserti128_si256(_mm256_castsi128_si256(_w), _w, 1);

                    __m256i _sl0_1 = _mm256_mullo_epi16(_val01_16, _ww);
                    __m256i _sh0_1 = _mm256_mulhi_epi16(_val01_16, _ww);

                    _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                    _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));

                    tmpptr += 16;
                    kptr0 += 4;
                }

                __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
                __m128i _sum1 = _mm256_extracti128_si256(_sum1_3, 0);
                __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
                __m128i _sum3 = _mm256_extracti128_si256(_sum1_3, 1);

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
                sum2 = _mm_reduce_add_epi32(_sum2);
                sum3 = _mm_reduce_add_epi32(_sum3);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char val2 = tmpptr[2];
                signed char val3 = tmpptr[3];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;
                sum2 += val2 * w;
                sum3 += val3 * w;

                tmpptr += 4;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0[2] = sum2;
            outptr0[3] = sum3;
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;

            if (nn4 > 0)
            {
                __m128i _sum0 = _mm_setzero_si128();
                __m128i _sum1 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val);
                    __m128i _val01 = _mm_unpacklo_epi8(_val, _extval);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif
                    _w = _mm_shuffle_epi32(_w, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _sl01 = _mm_mullo_epi16(_val01, _w);
                    __m128i _sh01 = _mm_mulhi_epi16(_val01, _w);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 8;
                    kptr0 += 4;
                }

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;

                tmpptr += 2;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum = 0;

            if (nn4 > 0)
            {
                __m128i _sum = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val = _mm_cvtepi8_epi16(_val0123);
#else
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                    __m128i _val = _mm_unpacklo_epi8(_val0123, _extval);
#endif

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif

                    __m128i _sl = _mm_mullo_epi16(_val, _w);
                    __m128i _sh = _mm_mulhi_epi16(_val, _w);

                    _sum = _mm_add_epi32(_sum, _mm_unpacklo_epi16(_sl, _sh));

                    tmpptr += 4;
                    kptr0 += 4;
                }

                sum = _mm_reduce_add_epi32(_sum);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#else  // __SSE2__
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i);
            const signed char* kptr0 = kernel.channel(p);

            int nn1 = inch * maxk;

            int sum = 0;
            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#endif // __SSE2__
    }
}